

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::delete_sync(NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_VALUE is generated if sync is neither zero or the name of a sync object.",
             &local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glDeleteSync(&ctx->super_CallLogWrapper,(GLsync)&DAT_00000001);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glDeleteSync(&ctx->super_CallLogWrapper,(GLsync)0x0);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void delete_sync (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if sync is neither zero or the name of a sync object.");
	ctx.glDeleteSync((GLsync)1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glDeleteSync(0);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();
}